

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

bool __thiscall cmDocumentation::PrintHelpOneManual(cmDocumentation *this,ostream *os)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  long *plVar4;
  ostream *poVar5;
  size_type *psVar6;
  long *plVar7;
  cmDocumentation *pcVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string mname;
  undefined1 local_d8 [24];
  undefined1 auStack_c0 [8];
  undefined8 local_b8;
  pointer local_b0;
  long local_a8 [2];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_78;
  pointer pRStack_60;
  pointer local_58;
  pointer local_50;
  size_t local_48;
  char *local_40;
  size_type local_38;
  
  pcVar8 = (cmDocumentation *)local_d8;
  pcVar1 = (this->CurrentArgument)._M_dataplus._M_p;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + (this->CurrentArgument)._M_string_length);
  if ((((pointer)0x3 < local_b0) && (*(char *)(local_b8 + -3 + (long)local_b0) == '(')) &&
     (*(char *)(local_b8 + -1 + (long)local_b0) == ')')) {
    std::__cxx11::string::substr((ulong)local_98,(ulong)&local_b8);
    plVar4 = (long *)std::__cxx11::string::append(local_98);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      local_d8._16_8_ = *psVar6;
      auStack_c0 = (undefined1  [8])plVar4[3];
      local_d8._0_8_ = local_d8 + 0x10;
    }
    else {
      local_d8._16_8_ = *psVar6;
      local_d8._0_8_ = (size_type *)*plVar4;
    }
    local_d8._8_8_ = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_d8,local_d8._8_8_,0,'\x01');
    plVar7 = plVar4 + 2;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)*plVar4 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)plVar7) {
      local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7
      ;
      pRStack_60 = (pointer)plVar4[3];
      local_78.first._M_len = (size_t)&local_78.second;
    }
    else {
      local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7
      ;
      local_78.first._M_len = (size_t)*plVar4;
    }
    local_78.first._M_str = (char *)plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_b8,(string *)(local_88 + 0x10));
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_78.first._M_len
        != &local_78.second) {
      operator_delete((void *)local_78.first._M_len,(long)local_78.second + 1);
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
    }
  }
  local_78.first._M_len = 7;
  local_78.first._M_str = "manual/";
  local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pRStack_60 = local_b0;
  local_58 = (pointer)local_b8;
  local_50 = (pointer)0x0;
  views._M_len = 2;
  views._M_array = (iterator)(local_88 + 0x10);
  cmCatViews((string *)local_d8,views);
  bVar2 = PrintFiles(pcVar8,os,(string *)local_d8);
  bVar3 = true;
  if (!bVar2) {
    local_78.first._M_len = 7;
    local_78.first._M_str = "manual/";
    local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pRStack_60 = local_b0;
    local_58 = (pointer)local_b8;
    local_50 = (pointer)0x0;
    local_48 = 6;
    local_40 = ".[0-9]";
    local_38 = 0;
    pcVar8 = (cmDocumentation *)local_98;
    views_00._M_len = 3;
    views_00._M_array = (iterator)(local_88 + 0x10);
    cmCatViews((string *)pcVar8,views_00);
    bVar3 = PrintFiles(pcVar8,os,(string *)local_98);
    if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
    }
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if (bVar3 == false) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Argument \"",10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->CurrentArgument)._M_dataplus._M_p,
                        (this->CurrentArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "\" to --help-manual is not an available manual.  Use --help-manual-list to see all available manuals.\n"
               ,0x65);
  }
  if ((long *)local_b8 != local_a8) {
    operator_delete((void *)local_b8,local_a8[0] + 1);
  }
  return bVar3;
}

Assistant:

bool cmDocumentation::PrintHelpOneManual(std::ostream& os)
{
  std::string mname = this->CurrentArgument;
  std::string::size_type mlen = mname.length();
  if (mlen > 3 && mname[mlen - 3] == '(' && mname[mlen - 1] == ')') {
    mname = mname.substr(0, mlen - 3) + "." + mname[mlen - 2];
  }
  if (this->PrintFiles(os, cmStrCat("manual/", mname)) ||
      this->PrintFiles(os, cmStrCat("manual/", mname, ".[0-9]"))) {
    return true;
  }
  // Argument was not a manual.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-manual is not an available manual.  "
        "Use --help-manual-list to see all available manuals.\n";
  return false;
}